

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O3

size_t KeccakP1600_12rounds_FastLoop_Absorb
                 (void *state,uint laneCount,uchar *data,size_t dataByteLen)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  
  local_f8 = *(ulong *)((long)state + 8);
  local_118 = *state;
  uVar30 = *(ulong *)((long)state + 0x80);
  local_a8 = *(ulong *)((long)state + 0xb8);
  local_d0 = *(ulong *)((long)state + 0x18);
  local_d8 = *(ulong *)((long)state + 0x10);
  local_c8 = *(ulong *)((long)state + 0x38);
  local_e0 = *(ulong *)((long)state + 0x20);
  local_128 = *(ulong *)((long)state + 0x48);
  local_100 = *(ulong *)((long)state + 0x28);
  local_148 = *(ulong *)((long)state + 0x50);
  local_120 = *(ulong *)((long)state + 0x30);
  local_e8 = *(ulong *)((long)state + 0x58);
  local_108 = *(ulong *)((long)state + 0x40);
  local_158 = *(ulong *)((long)state + 0x68);
  local_130 = *(ulong *)((long)state + 0x60);
  local_110 = *(ulong *)((long)state + 0x70);
  local_138 = *(ulong *)((long)state + 0x90);
  local_f0 = *(ulong *)((long)state + 0x78);
  local_c0 = *(ulong *)((long)state + 0xb0);
  local_140 = *(ulong *)((long)state + 0x88);
  local_150 = *(ulong *)((long)state + 0x98);
  local_160 = *(ulong *)((long)state + 0xa0);
  local_b8 = *(ulong *)((long)state + 0xa8);
  local_b0 = *(ulong *)((long)state + 0xc0);
  uVar15 = (ulong)(laneCount * 8);
  uVar17 = dataByteLen;
  if (uVar15 <= dataByteLen) {
    do {
      if (laneCount == 0x15) {
        local_150 = local_150 ^ *(ulong *)((long)data + 0x98);
        uVar30 = uVar30 ^ *(ulong *)((long)data + 0x80);
        local_d8 = local_d8 ^ *(ulong *)((long)data + 0x10);
        local_f8 = local_f8 ^ *(ulong *)((long)data + 8);
        local_118 = local_118 ^ *(ulong *)data;
        local_110 = local_110 ^ *(ulong *)((long)data + 0x70);
        local_120 = local_120 ^ *(ulong *)((long)data + 0x30);
        local_128 = local_128 ^ *(ulong *)((long)data + 0x48);
        local_148 = local_148 ^ *(ulong *)((long)data + 0x50);
        local_130 = local_130 ^ *(ulong *)((long)data + 0x60);
        local_140 = local_140 ^ *(ulong *)((long)data + 0x88);
        local_138 = local_138 ^ *(ulong *)((long)data + 0x90);
        local_160 = local_160 ^ *(ulong *)((long)data + 0xa0);
        local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
        local_d0 = local_d0 ^ *(ulong *)((long)data + 0x18);
        local_c8 = local_c8 ^ *(ulong *)((long)data + 0x38);
        local_100 = local_100 ^ *(ulong *)((long)data + 0x28);
        local_e8 = local_e8 ^ *(ulong *)((long)data + 0x58);
        local_108 = local_108 ^ *(ulong *)((long)data + 0x40);
        local_f0 = local_f0 ^ *(ulong *)((long)data + 0x78);
        local_158 = local_158 ^ *(ulong *)((long)data + 0x68);
      }
      else if (laneCount < 0x10) {
        if (laneCount < 8) {
          if (laneCount < 4) {
            if (laneCount < 2) {
              if (laneCount != 0) {
                local_118 = local_118 ^ *(ulong *)data;
              }
            }
            else {
              local_118 = local_118 ^ *(ulong *)data;
              local_f8 = local_f8 ^ *(ulong *)((long)data + 8);
              if (laneCount == 3) {
                local_d8 = local_d8 ^ *(ulong *)((long)data + 0x10);
              }
            }
          }
          else {
            local_f8 = local_f8 ^ *(ulong *)((long)data + 8);
            local_118 = local_118 ^ *(ulong *)data;
            local_d8 = local_d8 ^ *(ulong *)((long)data + 0x10);
            local_d0 = local_d0 ^ *(ulong *)((long)data + 0x18);
            if (laneCount < 6) {
              if (laneCount != 4) {
                local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
              }
            }
            else {
              local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
              local_100 = local_100 ^ *(ulong *)((long)data + 0x28);
              if (laneCount == 7) {
                local_120 = local_120 ^ *(ulong *)((long)data + 0x30);
              }
            }
          }
        }
        else {
          local_f8 = local_f8 ^ *(ulong *)((long)data + 8);
          local_d8 = local_d8 ^ *(ulong *)((long)data + 0x10);
          local_118 = local_118 ^ *(ulong *)data;
          local_120 = local_120 ^ *(ulong *)((long)data + 0x30);
          local_d0 = local_d0 ^ *(ulong *)((long)data + 0x18);
          local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
          local_100 = local_100 ^ *(ulong *)((long)data + 0x28);
          local_c8 = local_c8 ^ *(ulong *)((long)data + 0x38);
          if (laneCount < 0xc) {
            if (laneCount < 10) {
              if (laneCount != 8) {
                local_108 = local_108 ^ *(ulong *)((long)data + 0x40);
              }
            }
            else {
              local_128 = local_128 ^ *(ulong *)((long)data + 0x48);
              local_108 = local_108 ^ *(ulong *)((long)data + 0x40);
              if (laneCount == 0xb) {
                local_148 = local_148 ^ *(ulong *)((long)data + 0x50);
              }
            }
          }
          else {
            local_108 = local_108 ^ *(ulong *)((long)data + 0x40);
            local_148 = local_148 ^ *(ulong *)((long)data + 0x50);
            local_e8 = local_e8 ^ *(ulong *)((long)data + 0x58);
            local_128 = local_128 ^ *(ulong *)((long)data + 0x48);
            if (laneCount < 0xe) {
              if (laneCount != 0xc) {
                local_130 = local_130 ^ *(ulong *)((long)data + 0x60);
              }
            }
            else {
              local_130 = local_130 ^ *(ulong *)((long)data + 0x60);
              local_158 = local_158 ^ *(ulong *)((long)data + 0x68);
              if (laneCount == 0xf) {
                local_110 = local_110 ^ *(ulong *)((long)data + 0x70);
              }
            }
          }
        }
      }
      else {
        local_f8 = local_f8 ^ *(ulong *)((long)data + 8);
        local_d8 = local_d8 ^ *(ulong *)((long)data + 0x10);
        local_118 = local_118 ^ *(ulong *)data;
        local_110 = local_110 ^ *(ulong *)((long)data + 0x70);
        local_d0 = local_d0 ^ *(ulong *)((long)data + 0x18);
        local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
        local_100 = local_100 ^ *(ulong *)((long)data + 0x28);
        local_120 = local_120 ^ *(ulong *)((long)data + 0x30);
        local_c8 = local_c8 ^ *(ulong *)((long)data + 0x38);
        local_108 = local_108 ^ *(ulong *)((long)data + 0x40);
        local_128 = local_128 ^ *(ulong *)((long)data + 0x48);
        local_148 = local_148 ^ *(ulong *)((long)data + 0x50);
        local_e8 = local_e8 ^ *(ulong *)((long)data + 0x58);
        local_158 = local_158 ^ *(ulong *)((long)data + 0x68);
        local_f0 = local_f0 ^ *(ulong *)((long)data + 0x78);
        local_130 = local_130 ^ *(ulong *)((long)data + 0x60);
        if (laneCount < 0x18) {
          if (laneCount < 0x14) {
            if (laneCount < 0x12) {
              if (laneCount != 0x10) {
                uVar30 = uVar30 ^ *(ulong *)((long)data + 0x80);
              }
            }
            else {
              uVar30 = uVar30 ^ *(ulong *)((long)data + 0x80);
              local_140 = local_140 ^ *(ulong *)((long)data + 0x88);
              if (laneCount == 0x13) {
                local_138 = local_138 ^ *(ulong *)((long)data + 0x90);
              }
            }
          }
          else {
            uVar30 = uVar30 ^ *(ulong *)((long)data + 0x80);
            local_140 = local_140 ^ *(ulong *)((long)data + 0x88);
            local_150 = local_150 ^ *(ulong *)((long)data + 0x98);
            local_138 = local_138 ^ *(ulong *)((long)data + 0x90);
            if (0x15 < laneCount) {
              local_b8 = local_b8 ^ *(ulong *)((long)data + 0xa8);
              local_160 = local_160 ^ *(ulong *)((long)data + 0xa0);
              if (laneCount == 0x17) {
                local_c0 = local_c0 ^ *(ulong *)((long)data + 0xb0);
              }
            }
          }
        }
        else {
          local_150 = local_150 ^ *(ulong *)((long)data + 0x98);
          local_a8 = local_a8 ^ *(ulong *)((long)data + 0xb8);
          uVar30 = uVar30 ^ *(ulong *)((long)data + 0x80);
          local_138 = local_138 ^ *(ulong *)((long)data + 0x90);
          local_160 = local_160 ^ *(ulong *)((long)data + 0xa0);
          local_140 = local_140 ^ *(ulong *)((long)data + 0x88);
          local_b8 = local_b8 ^ *(ulong *)((long)data + 0xa8);
          local_c0 = local_c0 ^ *(ulong *)((long)data + 0xb0);
          if (laneCount != 0x18) {
            local_b0 = local_b0 ^ *(ulong *)((long)data + 0xc0);
          }
        }
      }
      uVar4 = local_e8 ^ local_120 ^ uVar30 ^ local_b8 ^ local_f8;
      uVar27 = local_130 ^ local_c8 ^ local_140 ^ local_c0 ^ local_d8;
      uVar18 = local_148 ^ local_100 ^ local_f0 ^ local_160 ^ local_118;
      uVar11 = local_110 ^ local_128 ^ local_150 ^ local_b0 ^ local_e0;
      uVar31 = local_158 ^ local_108 ^ local_138 ^ local_a8 ^ local_d0;
      uVar1 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar4;
      uVar5 = (uVar27 >> 0x3f | uVar27 << 1) ^ uVar18;
      uVar16 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar11;
      uVar2 = (local_120 ^ uVar5) >> 0x14 | (local_120 ^ uVar5) << 0x2c;
      uVar27 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar27;
      local_118 = local_118 ^ uVar16;
      uVar11 = (local_130 ^ uVar1) >> 0x15 | (local_130 ^ uVar1) << 0x2b;
      uVar31 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar31;
      uVar4 = local_118 ^ 0x8000808b ^ ~uVar2 & uVar11;
      uVar36 = (local_138 ^ uVar27) >> 0x2b | (local_138 ^ uVar27) << 0x15;
      uVar18 = (local_b0 ^ uVar31) >> 0x32 | (local_b0 ^ uVar31) << 0xe;
      uVar6 = ~uVar11 & uVar36 ^ uVar2;
      uVar11 = ~uVar36 & uVar18 ^ uVar11;
      uVar3 = ~local_118 & uVar2 ^ uVar18;
      uVar12 = (local_128 ^ uVar31) >> 0x2c | (local_128 ^ uVar31) << 0x14;
      uVar36 = ~uVar18 & local_118 ^ uVar36;
      uVar2 = (local_d0 ^ uVar27) >> 0x24 | (local_d0 ^ uVar27) << 0x1c;
      uVar37 = (local_c0 ^ uVar1) >> 3 | (local_c0 ^ uVar1) << 0x3d;
      uVar18 = (uVar30 ^ uVar5) >> 0x13 | (uVar30 ^ uVar5) << 0x2d;
      uVar19 = (local_148 ^ uVar16) >> 0x3d | (local_148 ^ uVar16) << 3;
      uVar30 = ~uVar37 & uVar2 ^ uVar18;
      uVar7 = ~uVar18 & uVar37 ^ uVar19;
      uVar21 = ~uVar19 & uVar18 ^ uVar12;
      uVar20 = ~uVar12 & uVar19 ^ uVar2;
      uVar37 = ~uVar2 & uVar12 ^ uVar37;
      uVar18 = (local_f8 ^ uVar5) >> 0x3f | (local_f8 ^ uVar5) << 1;
      uVar2 = (local_160 ^ uVar16) >> 0x2e | (local_160 ^ uVar16) << 0x12;
      uVar22 = (local_150 ^ uVar31) >> 0x38 | (local_150 ^ uVar31) << 8;
      uVar19 = (local_158 ^ uVar27) >> 0x27 | (local_158 ^ uVar27) << 0x19;
      uVar12 = (local_c8 ^ uVar1) >> 0x3a | (local_c8 ^ uVar1) << 6;
      uVar8 = ~uVar2 & uVar18 ^ uVar22;
      uVar23 = ~uVar22 & uVar2 ^ uVar19;
      uVar32 = ~uVar19 & uVar22 ^ uVar12;
      uVar22 = ~uVar12 & uVar19 ^ uVar18;
      uVar2 = ~uVar18 & uVar12 ^ uVar2;
      uVar9 = (local_a8 ^ uVar27) >> 8 | (local_a8 ^ uVar27) << 0x38;
      uVar24 = (local_140 ^ uVar1) >> 0x31 | (local_140 ^ uVar1) << 0xf;
      uVar13 = (local_e8 ^ uVar5) >> 0x36 | (local_e8 ^ uVar5) << 10;
      uVar18 = (local_e0 ^ uVar31) >> 0x25 | (local_e0 ^ uVar31) << 0x1b;
      uVar19 = (local_100 ^ uVar16) >> 0x1c | (local_100 ^ uVar16) << 0x24;
      uVar12 = ~uVar24 & uVar9 ^ uVar13;
      uVar10 = ~uVar13 & uVar24 ^ uVar19;
      uVar24 = ~uVar9 & uVar18 ^ uVar24;
      uVar27 = (uVar27 ^ local_108) >> 9 | (uVar27 ^ local_108) << 0x37;
      uVar14 = ~uVar19 & uVar13 ^ uVar18;
      uVar25 = (uVar5 ^ local_b8) >> 0x3e | (uVar5 ^ local_b8) << 2;
      uVar33 = (uVar1 ^ local_d8) >> 2 | (uVar1 ^ local_d8) << 0x3e;
      uVar9 = ~uVar18 & uVar19 ^ uVar9;
      uVar1 = (uVar31 ^ local_110) >> 0x19 | (uVar31 ^ local_110) << 0x27;
      uVar18 = (uVar16 ^ local_f0) >> 0x17 | (uVar16 ^ local_f0) << 0x29;
      uVar19 = ~uVar18 & uVar25 ^ uVar1;
      uVar39 = ~uVar27 & uVar1 ^ uVar33;
      uVar5 = uVar14 ^ uVar20 ^ uVar4 ^ uVar22 ^ uVar39;
      uVar13 = ~uVar25 & uVar33 ^ uVar18;
      uVar28 = ~uVar1 & uVar18 ^ uVar27;
      uVar18 = uVar10 ^ uVar32 ^ uVar21 ^ uVar6 ^ uVar28;
      uVar25 = ~uVar33 & uVar27 ^ uVar25;
      uVar1 = uVar19 ^ uVar11 ^ uVar7 ^ uVar12 ^ uVar23;
      uVar27 = uVar13 ^ uVar36 ^ uVar8 ^ uVar30 ^ uVar24;
      uVar34 = (uVar27 >> 0x3f | uVar27 << 1) ^ uVar18;
      uVar33 = uVar2 ^ uVar37 ^ uVar3 ^ uVar25 ^ uVar9;
      uVar23 = uVar23 ^ uVar34;
      uVar19 = uVar19 ^ uVar34;
      uVar31 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar33;
      uVar16 = uVar19 >> 3 | uVar19 << 0x3d;
      uVar26 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar5;
      uVar1 = (uVar33 >> 0x3f | uVar33 << 1) ^ uVar1;
      uVar4 = uVar4 ^ uVar31;
      uVar39 = uVar39 ^ uVar31;
      uVar27 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar27;
      uVar24 = uVar24 ^ uVar1;
      uVar18 = uVar23 >> 0x15 | uVar23 << 0x2b;
      uVar25 = uVar25 ^ uVar27;
      uVar19 = uVar24 >> 0x2b | uVar24 << 0x15;
      uVar21 = uVar21 ^ uVar26;
      uVar25 = uVar25 >> 0x32 | uVar25 << 0xe;
      uVar5 = uVar21 >> 0x14 | uVar21 << 0x2c;
      uVar24 = ~uVar19 & uVar25 ^ uVar18;
      uVar21 = ~uVar18 & uVar19 ^ uVar5;
      uVar18 = uVar4 ^ 0x800000000000008b ^ ~uVar5 & uVar18;
      uVar23 = ~uVar4 & uVar5 ^ uVar25;
      uVar19 = ~uVar25 & uVar4 ^ uVar19;
      uVar36 = uVar36 ^ uVar1;
      uVar4 = uVar36 >> 0x24 | uVar36 << 0x1c;
      uVar10 = uVar10 ^ uVar26;
      uVar37 = uVar37 ^ uVar27;
      uVar10 = uVar10 >> 0x13 | uVar10 << 0x2d;
      uVar37 = uVar37 >> 0x2c | uVar37 << 0x14;
      uVar22 = uVar22 ^ uVar31;
      uVar36 = uVar22 >> 0x3d | uVar22 << 3;
      uVar5 = ~uVar16 & uVar4 ^ uVar10;
      uVar25 = ~uVar36 & uVar10 ^ uVar37;
      uVar10 = ~uVar10 & uVar16 ^ uVar36;
      uVar36 = ~uVar37 & uVar36 ^ uVar4;
      uVar16 = ~uVar4 & uVar37 ^ uVar16;
      uVar8 = uVar8 ^ uVar1;
      uVar6 = uVar6 ^ uVar26;
      uVar7 = uVar7 ^ uVar34;
      uVar8 = uVar8 >> 0x27 | uVar8 << 0x19;
      uVar9 = uVar9 ^ uVar27;
      uVar22 = uVar6 >> 0x3f | uVar6 << 1;
      uVar7 = uVar7 >> 0x3a | uVar7 << 6;
      uVar37 = uVar9 >> 0x38 | uVar9 << 8;
      uVar6 = uVar39 >> 0x2e | uVar39 << 0x12;
      uVar9 = ~uVar6 & uVar22 ^ uVar37;
      uVar4 = ~uVar8 & uVar37 ^ uVar7;
      uVar33 = ~uVar37 & uVar6 ^ uVar8;
      uVar8 = ~uVar7 & uVar8 ^ uVar22;
      uVar6 = ~uVar22 & uVar7 ^ uVar6;
      uVar3 = uVar3 ^ uVar27;
      uVar27 = uVar27 ^ uVar2;
      uVar20 = uVar20 ^ uVar31;
      uVar32 = uVar32 ^ uVar26;
      uVar22 = uVar3 >> 0x25 | uVar3 << 0x1b;
      uVar26 = uVar26 ^ uVar28;
      uVar31 = uVar31 ^ uVar14;
      uVar7 = uVar20 >> 0x1c | uVar20 << 0x24;
      uVar3 = uVar32 >> 0x36 | uVar32 << 10;
      uVar2 = ~uVar7 & uVar3 ^ uVar22;
      uVar12 = uVar12 ^ uVar34;
      uVar34 = uVar34 ^ uVar11;
      uVar37 = uVar12 >> 0x31 | uVar12 << 0xf;
      uVar11 = ~uVar3 & uVar37 ^ uVar7;
      uVar14 = uVar34 >> 2 | uVar34 << 0x3e;
      uVar13 = uVar13 ^ uVar1;
      uVar1 = uVar1 ^ uVar30;
      uVar30 = uVar13 >> 8 | uVar13 << 0x38;
      uVar13 = ~uVar22 & uVar7 ^ uVar30;
      uVar3 = ~uVar37 & uVar30 ^ uVar3;
      uVar37 = ~uVar30 & uVar22 ^ uVar37;
      uVar12 = uVar31 >> 0x17 | uVar31 << 0x29;
      uVar30 = uVar1 >> 9 | uVar1 << 0x37;
      uVar22 = uVar27 >> 0x19 | uVar27 << 0x27;
      uVar1 = uVar26 >> 0x3e | uVar26 << 2;
      uVar27 = ~uVar1 & uVar14 ^ uVar12;
      uVar32 = ~uVar30 & uVar22 ^ uVar14;
      uVar20 = uVar8 ^ uVar2 ^ uVar18 ^ uVar36 ^ uVar32;
      uVar34 = ~uVar22 & uVar12 ^ uVar30;
      uVar22 = ~uVar12 & uVar1 ^ uVar22;
      uVar12 = uVar9 ^ uVar37 ^ uVar19 ^ uVar5 ^ uVar27;
      uVar1 = ~uVar14 & uVar30 ^ uVar1;
      uVar7 = uVar4 ^ uVar11 ^ uVar21 ^ uVar25 ^ uVar34;
      uVar31 = uVar33 ^ uVar3 ^ uVar24 ^ uVar10 ^ uVar22;
      uVar30 = uVar6 ^ uVar13 ^ uVar23 ^ uVar16 ^ uVar1;
      uVar35 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar7;
      uVar14 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar30;
      uVar40 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar20;
      uVar33 = uVar33 ^ uVar35;
      uVar22 = uVar22 ^ uVar35;
      uVar31 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar31;
      uVar7 = uVar22 >> 3 | uVar22 << 0x3d;
      uVar12 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar12;
      uVar37 = uVar37 ^ uVar31;
      uVar1 = uVar1 ^ uVar12;
      uVar22 = uVar37 >> 0x2b | uVar37 << 0x15;
      uVar30 = uVar1 >> 0x32 | uVar1 << 0xe;
      uVar18 = uVar18 ^ uVar14;
      uVar25 = uVar25 ^ uVar40;
      uVar1 = uVar25 >> 0x14 | uVar25 << 0x2c;
      uVar37 = uVar33 >> 0x15 | uVar33 << 0x2b;
      uVar20 = ~uVar22 & uVar30 ^ uVar37;
      uVar33 = ~uVar37 & uVar22 ^ uVar1;
      uVar37 = uVar18 ^ 0x8000000000008089 ^ ~uVar1 & uVar37;
      uVar32 = uVar32 ^ uVar14;
      uVar22 = ~uVar30 & uVar18 ^ uVar22;
      uVar30 = ~uVar18 & uVar1 ^ uVar30;
      uVar19 = uVar19 ^ uVar31;
      uVar8 = uVar8 ^ uVar14;
      uVar16 = uVar16 ^ uVar12;
      uVar1 = uVar19 >> 0x24 | uVar19 << 0x1c;
      uVar8 = uVar8 >> 0x3d | uVar8 << 3;
      uVar19 = uVar16 >> 0x2c | uVar16 << 0x14;
      uVar28 = ~uVar19 & uVar8 ^ uVar1;
      uVar18 = ~uVar1 & uVar19 ^ uVar7;
      uVar11 = uVar11 ^ uVar40;
      uVar11 = uVar11 >> 0x13 | uVar11 << 0x2d;
      uVar29 = ~uVar7 & uVar1 ^ uVar11;
      uVar26 = ~uVar11 & uVar7 ^ uVar8;
      uVar19 = ~uVar8 & uVar11 ^ uVar19;
      uVar21 = uVar21 ^ uVar40;
      uVar11 = uVar32 >> 0x2e | uVar32 << 0x12;
      uVar1 = uVar21 >> 0x3f | uVar21 << 1;
      uVar9 = uVar9 ^ uVar31;
      uVar16 = uVar9 >> 0x27 | uVar9 << 0x19;
      uVar10 = uVar10 ^ uVar35;
      uVar21 = uVar10 >> 0x3a | uVar10 << 6;
      uVar13 = uVar13 ^ uVar12;
      uVar13 = uVar13 >> 0x38 | uVar13 << 8;
      uVar7 = ~uVar11 & uVar1 ^ uVar13;
      uVar32 = ~uVar16 & uVar13 ^ uVar21;
      uVar10 = ~uVar13 & uVar11 ^ uVar16;
      uVar13 = ~uVar21 & uVar16 ^ uVar1;
      uVar11 = ~uVar1 & uVar21 ^ uVar11;
      uVar36 = uVar36 ^ uVar14;
      uVar16 = uVar36 >> 0x1c | uVar36 << 0x24;
      uVar23 = uVar23 ^ uVar12;
      uVar12 = uVar12 ^ uVar6;
      uVar21 = uVar23 >> 0x25 | uVar23 << 0x1b;
      uVar27 = uVar27 ^ uVar31;
      uVar31 = uVar31 ^ uVar5;
      uVar3 = uVar3 ^ uVar35;
      uVar35 = uVar35 ^ uVar24;
      uVar4 = uVar4 ^ uVar40;
      uVar9 = uVar3 >> 0x31 | uVar3 << 0xf;
      uVar40 = uVar40 ^ uVar34;
      uVar5 = uVar4 >> 0x36 | uVar4 << 10;
      uVar39 = ~uVar16 & uVar5 ^ uVar21;
      uVar23 = uVar40 >> 0x3e | uVar40 << 2;
      uVar1 = ~uVar5 & uVar9 ^ uVar16;
      uVar4 = uVar27 >> 8 | uVar27 << 0x38;
      uVar5 = ~uVar9 & uVar4 ^ uVar5;
      uVar36 = uVar12 >> 0x19 | uVar12 << 0x27;
      uVar9 = ~uVar4 & uVar21 ^ uVar9;
      uVar4 = ~uVar21 & uVar16 ^ uVar4;
      uVar3 = uVar35 >> 2 | uVar35 << 0x3e;
      uVar12 = uVar31 >> 9 | uVar31 << 0x37;
      uVar21 = ~uVar3 & uVar12 ^ uVar23;
      uVar6 = uVar11 ^ uVar4 ^ uVar30 ^ uVar18 ^ uVar21;
      uVar14 = uVar14 ^ uVar2;
      uVar2 = uVar14 >> 0x17 | uVar14 << 0x29;
      uVar16 = ~uVar23 & uVar3 ^ uVar2;
      uVar35 = ~uVar36 & uVar2 ^ uVar12;
      uVar34 = uVar7 ^ uVar9 ^ uVar22 ^ uVar29 ^ uVar16;
      uVar27 = ~uVar2 & uVar23 ^ uVar36;
      uVar23 = uVar32 ^ uVar1 ^ uVar33 ^ uVar19 ^ uVar35;
      uVar3 = ~uVar12 & uVar36 ^ uVar3;
      uVar8 = uVar10 ^ uVar5 ^ uVar20 ^ uVar26 ^ uVar27;
      uVar2 = (uVar34 >> 0x3f | uVar34 << 1) ^ uVar23;
      uVar36 = uVar13 ^ uVar39 ^ uVar37 ^ uVar28 ^ uVar3;
      uVar25 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar36;
      uVar10 = uVar10 ^ uVar2;
      uVar12 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar6;
      uVar34 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar34;
      uVar8 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar8;
      uVar21 = uVar21 ^ uVar34;
      uVar3 = uVar3 ^ uVar12;
      uVar19 = uVar19 ^ uVar25;
      uVar9 = uVar9 ^ uVar8;
      uVar23 = uVar21 >> 0x32 | uVar21 << 0xe;
      uVar21 = uVar19 >> 0x14 | uVar19 << 0x2c;
      uVar6 = uVar9 >> 0x2b | uVar9 << 0x15;
      uVar27 = uVar27 ^ uVar2;
      uVar37 = uVar37 ^ uVar12;
      uVar19 = uVar10 >> 0x15 | uVar10 << 0x2b;
      uVar36 = uVar37 ^ 0x8000000000008003 ^ ~uVar21 & uVar19;
      uVar9 = ~uVar23 & uVar37 ^ uVar6;
      uVar40 = ~uVar6 & uVar23 ^ uVar19;
      uVar23 = ~uVar37 & uVar21 ^ uVar23;
      uVar21 = ~uVar19 & uVar6 ^ uVar21;
      uVar22 = uVar22 ^ uVar8;
      uVar10 = uVar27 >> 3 | uVar27 << 0x3d;
      uVar19 = uVar22 >> 0x24 | uVar22 << 0x1c;
      uVar18 = uVar18 ^ uVar34;
      uVar6 = uVar18 >> 0x2c | uVar18 << 0x14;
      uVar27 = ~uVar19 & uVar6 ^ uVar10;
      uVar33 = uVar33 ^ uVar25;
      uVar13 = uVar13 ^ uVar12;
      uVar18 = uVar13 >> 0x3d | uVar13 << 3;
      uVar7 = uVar7 ^ uVar8;
      uVar1 = uVar1 ^ uVar25;
      uVar1 = uVar1 >> 0x13 | uVar1 << 0x2d;
      uVar22 = ~uVar10 & uVar19 ^ uVar1;
      uVar24 = ~uVar18 & uVar1 ^ uVar6;
      uVar10 = ~uVar1 & uVar10 ^ uVar18;
      uVar19 = ~uVar6 & uVar18 ^ uVar19;
      uVar14 = uVar7 >> 0x27 | uVar7 << 0x19;
      uVar1 = uVar33 >> 0x3f | uVar33 << 1;
      uVar18 = uVar3 >> 0x2e | uVar3 << 0x12;
      uVar26 = uVar26 ^ uVar2;
      uVar37 = uVar26 >> 0x3a | uVar26 << 6;
      uVar4 = uVar4 ^ uVar34;
      uVar4 = uVar4 >> 0x38 | uVar4 << 8;
      uVar7 = ~uVar37 & uVar14 ^ uVar1;
      uVar31 = ~uVar18 & uVar1 ^ uVar4;
      uVar1 = ~uVar1 & uVar37 ^ uVar18;
      uVar37 = ~uVar14 & uVar4 ^ uVar37;
      uVar14 = ~uVar4 & uVar18 ^ uVar14;
      uVar30 = uVar30 ^ uVar34;
      uVar28 = uVar28 ^ uVar12;
      uVar12 = uVar12 ^ uVar39;
      uVar18 = uVar30 >> 0x25 | uVar30 << 0x1b;
      uVar33 = uVar28 >> 0x1c | uVar28 << 0x24;
      uVar32 = uVar32 ^ uVar25;
      uVar30 = uVar32 >> 0x36 | uVar32 << 10;
      uVar6 = ~uVar33 & uVar30 ^ uVar18;
      uVar5 = uVar5 ^ uVar2;
      uVar2 = uVar2 ^ uVar20;
      uVar4 = uVar5 >> 0x31 | uVar5 << 0xf;
      uVar3 = ~uVar30 & uVar4 ^ uVar33;
      uVar16 = uVar16 ^ uVar8;
      uVar13 = uVar16 >> 8 | uVar16 << 0x38;
      uVar16 = ~uVar13 & uVar18 ^ uVar4;
      uVar30 = ~uVar4 & uVar13 ^ uVar30;
      uVar25 = uVar25 ^ uVar35;
      uVar5 = uVar2 >> 2 | uVar2 << 0x3e;
      uVar13 = ~uVar18 & uVar33 ^ uVar13;
      uVar8 = uVar8 ^ uVar29;
      uVar34 = uVar34 ^ uVar11;
      uVar11 = uVar12 >> 0x17 | uVar12 << 0x29;
      uVar4 = uVar8 >> 9 | uVar8 << 0x37;
      uVar2 = uVar34 >> 0x19 | uVar34 << 0x27;
      uVar18 = uVar25 >> 0x3e | uVar25 << 2;
      uVar32 = ~uVar18 & uVar5 ^ uVar11;
      uVar39 = ~uVar2 & uVar11 ^ uVar4;
      uVar8 = ~uVar4 & uVar2 ^ uVar5;
      uVar2 = ~uVar11 & uVar18 ^ uVar2;
      uVar20 = uVar31 ^ uVar16 ^ uVar9 ^ uVar22 ^ uVar32;
      uVar12 = uVar37 ^ uVar3 ^ uVar21 ^ uVar24 ^ uVar39;
      uVar35 = uVar7 ^ uVar6 ^ uVar36 ^ uVar19 ^ uVar8;
      uVar18 = ~uVar5 & uVar4 ^ uVar18;
      uVar26 = uVar14 ^ uVar30 ^ uVar40 ^ uVar10 ^ uVar2;
      uVar11 = uVar1 ^ uVar13 ^ uVar23 ^ uVar27 ^ uVar18;
      uVar4 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar12;
      uVar20 = (uVar35 >> 0x3f | uVar35 << 1) ^ uVar20;
      uVar25 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar11;
      uVar35 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar35;
      uVar14 = uVar14 ^ uVar4;
      uVar18 = uVar18 ^ uVar20;
      uVar2 = uVar2 ^ uVar4;
      uVar26 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar26;
      uVar11 = uVar14 >> 0x15 | uVar14 << 0x2b;
      uVar12 = uVar18 >> 0x32 | uVar18 << 0xe;
      uVar18 = uVar2 >> 3 | uVar2 << 0x3d;
      uVar16 = uVar16 ^ uVar26;
      uVar36 = uVar36 ^ uVar25;
      uVar24 = uVar24 ^ uVar35;
      uVar2 = uVar24 >> 0x14 | uVar24 << 0x2c;
      uVar14 = uVar36 ^ 0x8000000000008002 ^ ~uVar2 & uVar11;
      uVar5 = uVar16 >> 0x2b | uVar16 << 0x15;
      uVar28 = ~uVar5 & uVar12 ^ uVar11;
      uVar11 = ~uVar11 & uVar5 ^ uVar2;
      uVar33 = ~uVar36 & uVar2 ^ uVar12;
      uVar5 = ~uVar12 & uVar36 ^ uVar5;
      uVar3 = uVar3 ^ uVar35;
      uVar9 = uVar9 ^ uVar26;
      uVar3 = uVar3 >> 0x13 | uVar3 << 0x2d;
      uVar2 = uVar9 >> 0x24 | uVar9 << 0x1c;
      uVar7 = uVar7 ^ uVar25;
      uVar12 = uVar7 >> 0x3d | uVar7 << 3;
      uVar16 = ~uVar3 & uVar18 ^ uVar12;
      uVar34 = ~uVar18 & uVar2 ^ uVar3;
      uVar27 = uVar27 ^ uVar20;
      uVar36 = uVar27 >> 0x2c | uVar27 << 0x14;
      uVar3 = ~uVar12 & uVar3 ^ uVar36;
      uVar8 = uVar8 ^ uVar25;
      uVar9 = ~uVar36 & uVar12 ^ uVar2;
      uVar12 = uVar8 >> 0x2e | uVar8 << 0x12;
      uVar18 = ~uVar2 & uVar36 ^ uVar18;
      uVar31 = uVar31 ^ uVar26;
      uVar21 = uVar21 ^ uVar35;
      uVar13 = uVar13 ^ uVar20;
      uVar36 = uVar31 >> 0x27 | uVar31 << 0x19;
      uVar2 = uVar21 >> 0x3f | uVar21 << 1;
      uVar13 = uVar13 >> 0x38 | uVar13 << 8;
      uVar8 = ~uVar12 & uVar2 ^ uVar13;
      uVar7 = ~uVar13 & uVar12 ^ uVar36;
      uVar10 = uVar10 ^ uVar4;
      uVar21 = uVar10 >> 0x3a | uVar10 << 6;
      uVar29 = ~uVar36 & uVar13 ^ uVar21;
      uVar13 = ~uVar21 & uVar36 ^ uVar2;
      uVar12 = ~uVar2 & uVar21 ^ uVar12;
      uVar23 = uVar23 ^ uVar20;
      uVar20 = uVar20 ^ uVar1;
      uVar19 = uVar19 ^ uVar25;
      uVar37 = uVar37 ^ uVar35;
      uVar35 = uVar35 ^ uVar39;
      uVar19 = uVar19 >> 0x1c | uVar19 << 0x24;
      uVar27 = uVar37 >> 0x36 | uVar37 << 10;
      uVar1 = uVar23 >> 0x25 | uVar23 << 0x1b;
      uVar21 = ~uVar19 & uVar27 ^ uVar1;
      uVar30 = uVar30 ^ uVar4;
      uVar2 = uVar30 >> 0x31 | uVar30 << 0xf;
      uVar24 = ~uVar27 & uVar2 ^ uVar19;
      uVar32 = uVar32 ^ uVar26;
      uVar30 = uVar32 >> 8 | uVar32 << 0x38;
      uVar27 = ~uVar2 & uVar30 ^ uVar27;
      uVar26 = uVar26 ^ uVar22;
      uVar2 = ~uVar30 & uVar1 ^ uVar2;
      uVar30 = ~uVar1 & uVar19 ^ uVar30;
      uVar4 = uVar4 ^ uVar40;
      uVar25 = uVar25 ^ uVar6;
      uVar39 = uVar4 >> 2 | uVar4 << 0x3e;
      uVar4 = uVar26 >> 9 | uVar26 << 0x37;
      uVar6 = uVar20 >> 0x19 | uVar20 << 0x27;
      uVar22 = uVar35 >> 0x3e | uVar35 << 2;
      uVar19 = uVar25 >> 0x17 | uVar25 << 0x29;
      uVar1 = ~uVar22 & uVar39 ^ uVar19;
      uVar37 = ~uVar39 & uVar4 ^ uVar22;
      uVar36 = uVar8 ^ uVar2 ^ uVar5 ^ uVar34 ^ uVar1;
      uVar22 = ~uVar19 & uVar22 ^ uVar6;
      uVar35 = ~uVar6 & uVar19 ^ uVar4;
      uVar26 = uVar12 ^ uVar30 ^ uVar33 ^ uVar18 ^ uVar37;
      uVar39 = ~uVar4 & uVar6 ^ uVar39;
      uVar19 = uVar7 ^ uVar27 ^ uVar28 ^ uVar16 ^ uVar22;
      uVar4 = uVar29 ^ uVar24 ^ uVar11 ^ uVar3 ^ uVar35;
      uVar6 = uVar13 ^ uVar21 ^ uVar14 ^ uVar9 ^ uVar39;
      uVar31 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar4;
      uVar40 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar19;
      uVar10 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar6;
      uVar26 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar26;
      uVar2 = uVar2 ^ uVar40;
      uVar22 = uVar22 ^ uVar31;
      uVar36 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar36;
      uVar39 = uVar39 ^ uVar26;
      uVar3 = uVar3 ^ uVar10;
      uVar37 = uVar37 ^ uVar36;
      uVar4 = uVar3 >> 0x14 | uVar3 << 0x2c;
      uVar14 = uVar14 ^ uVar26;
      uVar7 = uVar7 ^ uVar31;
      uVar19 = uVar7 >> 0x15 | uVar7 << 0x2b;
      uVar23 = uVar14 ^ 0x8000000000000080 ^ ~uVar4 & uVar19;
      uVar6 = uVar37 >> 0x32 | uVar37 << 0xe;
      uVar3 = uVar22 >> 3 | uVar22 << 0x3d;
      uVar37 = uVar2 >> 0x2b | uVar2 << 0x15;
      uVar32 = ~uVar37 & uVar6 ^ uVar19;
      uVar22 = ~uVar19 & uVar37 ^ uVar4;
      uVar4 = ~uVar14 & uVar4 ^ uVar6;
      uVar37 = ~uVar6 & uVar14 ^ uVar37;
      uVar13 = uVar13 ^ uVar26;
      uVar18 = uVar18 ^ uVar36;
      uVar5 = uVar5 ^ uVar40;
      uVar24 = uVar24 ^ uVar10;
      uVar6 = uVar13 >> 0x3d | uVar13 << 3;
      uVar19 = uVar18 >> 0x2c | uVar18 << 0x14;
      uVar2 = uVar5 >> 0x24 | uVar5 << 0x1c;
      uVar5 = uVar24 >> 0x13 | uVar24 << 0x2d;
      uVar20 = ~uVar19 & uVar6 ^ uVar2;
      uVar25 = ~uVar3 & uVar2 ^ uVar5;
      uVar2 = ~uVar2 & uVar19 ^ uVar3;
      uVar19 = ~uVar6 & uVar5 ^ uVar19;
      uVar18 = uVar39 >> 0x2e | uVar39 << 0x12;
      uVar6 = ~uVar5 & uVar3 ^ uVar6;
      uVar8 = uVar8 ^ uVar40;
      uVar3 = uVar8 >> 0x27 | uVar8 << 0x19;
      uVar11 = uVar11 ^ uVar10;
      uVar11 = uVar11 >> 0x3f | uVar11 << 1;
      uVar30 = uVar30 ^ uVar36;
      uVar5 = uVar30 >> 0x38 | uVar30 << 8;
      uVar14 = ~uVar18 & uVar11 ^ uVar5;
      uVar16 = uVar16 ^ uVar31;
      uVar30 = uVar16 >> 0x3a | uVar16 << 6;
      uVar39 = ~uVar5 & uVar18 ^ uVar3;
      uVar33 = uVar33 ^ uVar36;
      uVar36 = uVar36 ^ uVar12;
      uVar13 = ~uVar3 & uVar5 ^ uVar30;
      uVar5 = uVar33 >> 0x25 | uVar33 << 0x1b;
      uVar8 = ~uVar30 & uVar3 ^ uVar11;
      uVar18 = ~uVar11 & uVar30 ^ uVar18;
      uVar9 = uVar9 ^ uVar26;
      uVar29 = uVar29 ^ uVar10;
      uVar30 = uVar29 >> 0x36 | uVar29 << 10;
      uVar12 = uVar9 >> 0x1c | uVar9 << 0x24;
      uVar7 = ~uVar12 & uVar30 ^ uVar5;
      uVar27 = uVar27 ^ uVar31;
      uVar11 = uVar27 >> 0x31 | uVar27 << 0xf;
      uVar3 = ~uVar30 & uVar11 ^ uVar12;
      uVar1 = uVar1 ^ uVar40;
      uVar40 = uVar40 ^ uVar34;
      uVar1 = uVar1 >> 8 | uVar1 << 0x38;
      uVar30 = ~uVar11 & uVar1 ^ uVar30;
      uVar33 = ~uVar5 & uVar12 ^ uVar1;
      uVar31 = uVar31 ^ uVar28;
      uVar10 = uVar10 ^ uVar35;
      uVar11 = ~uVar1 & uVar5 ^ uVar11;
      uVar35 = uVar40 >> 9 | uVar40 << 0x37;
      uVar36 = uVar36 >> 0x19 | uVar36 << 0x27;
      uVar26 = uVar26 ^ uVar21;
      uVar1 = uVar31 >> 2 | uVar31 << 0x3e;
      uVar10 = uVar10 >> 0x3e | uVar10 << 2;
      uVar31 = ~uVar35 & uVar36 ^ uVar1;
      uVar5 = ~uVar1 & uVar35 ^ uVar10;
      uVar16 = uVar8 ^ uVar7 ^ uVar23 ^ uVar20 ^ uVar31;
      uVar12 = uVar18 ^ uVar33 ^ uVar4 ^ uVar2 ^ uVar5;
      uVar21 = uVar26 >> 0x17 | uVar26 << 0x29;
      uVar29 = ~uVar10 & uVar1 ^ uVar21;
      uVar35 = ~uVar36 & uVar21 ^ uVar35;
      uVar36 = ~uVar21 & uVar10 ^ uVar36;
      uVar24 = uVar14 ^ uVar11 ^ uVar37 ^ uVar25 ^ uVar29;
      uVar1 = uVar13 ^ uVar3 ^ uVar22 ^ uVar19 ^ uVar35;
      uVar27 = uVar39 ^ uVar30 ^ uVar32 ^ uVar6 ^ uVar36;
      uVar38 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar1;
      uVar41 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar12;
      uVar40 = (uVar27 >> 0x3f | uVar27 << 1) ^ uVar16;
      uVar36 = uVar36 ^ uVar38;
      uVar27 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar27;
      uVar19 = uVar19 ^ uVar40;
      uVar21 = uVar36 >> 3 | uVar36 << 0x3d;
      uVar31 = uVar31 ^ uVar41;
      uVar24 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar24;
      uVar11 = uVar11 ^ uVar27;
      uVar1 = uVar19 >> 0x14 | uVar19 << 0x2c;
      uVar29 = uVar29 ^ uVar27;
      uVar5 = uVar5 ^ uVar24;
      uVar12 = uVar11 >> 0x2b | uVar11 << 0x15;
      uVar11 = uVar5 >> 0x32 | uVar5 << 0xe;
      uVar39 = uVar39 ^ uVar38;
      uVar23 = uVar23 ^ uVar41;
      uVar26 = uVar39 >> 0x15 | uVar39 << 0x2b;
      uVar9 = ~uVar11 & uVar23 ^ uVar12;
      uVar16 = ~uVar26 & uVar12 ^ uVar1;
      uVar5 = ~uVar12 & uVar11 ^ uVar26;
      uVar11 = ~uVar23 & uVar1 ^ uVar11;
      uVar37 = uVar37 ^ uVar27;
      uVar2 = uVar2 ^ uVar24;
      uVar12 = uVar37 >> 0x24 | uVar37 << 0x1c;
      uVar3 = uVar3 ^ uVar40;
      uVar2 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar3 = uVar3 >> 0x13 | uVar3 << 0x2d;
      uVar34 = ~uVar21 & uVar12 ^ uVar3;
      uVar8 = uVar8 ^ uVar41;
      uVar19 = uVar8 >> 0x3d | uVar8 << 3;
      uVar10 = ~uVar3 & uVar21 ^ uVar19;
      uVar3 = ~uVar19 & uVar3 ^ uVar2;
      uVar8 = ~uVar2 & uVar19 ^ uVar12;
      uVar19 = uVar31 >> 0x2e | uVar31 << 0x12;
      uVar21 = ~uVar12 & uVar2 ^ uVar21;
      uVar22 = uVar22 ^ uVar40;
      uVar2 = uVar22 >> 0x3f | uVar22 << 1;
      uVar33 = uVar33 ^ uVar24;
      uVar14 = uVar14 ^ uVar27;
      uVar27 = uVar27 ^ uVar25;
      uVar25 = uVar33 >> 0x38 | uVar33 << 8;
      uVar36 = uVar14 >> 0x27 | uVar14 << 0x19;
      uVar31 = ~uVar19 & uVar2 ^ uVar25;
      uVar22 = ~uVar25 & uVar19 ^ uVar36;
      uVar6 = uVar6 ^ uVar38;
      uVar37 = uVar27 >> 9 | uVar27 << 0x37;
      uVar12 = uVar6 >> 0x3a | uVar6 << 6;
      uVar28 = ~uVar36 & uVar25 ^ uVar12;
      uVar27 = ~uVar12 & uVar36 ^ uVar2;
      uVar19 = ~uVar2 & uVar12 ^ uVar19;
      uVar13 = uVar13 ^ uVar40;
      uVar40 = uVar40 ^ uVar35;
      uVar20 = uVar20 ^ uVar41;
      uVar33 = uVar29 >> 8 | uVar29 << 0x38;
      uVar2 = uVar13 >> 0x36 | uVar13 << 10;
      uVar41 = uVar41 ^ uVar7;
      uVar36 = uVar20 >> 0x1c | uVar20 << 0x24;
      uVar4 = uVar4 ^ uVar24;
      uVar24 = uVar24 ^ uVar18;
      uVar25 = uVar41 >> 0x17 | uVar41 << 0x29;
      uVar30 = uVar30 ^ uVar38;
      uVar38 = uVar38 ^ uVar32;
      uVar13 = uVar30 >> 0x31 | uVar30 << 0xf;
      uVar30 = ~uVar2 & uVar13 ^ uVar36;
      uVar12 = ~uVar13 & uVar33 ^ uVar2;
      uVar4 = uVar4 >> 0x25 | uVar4 << 0x1b;
      uVar13 = ~uVar33 & uVar4 ^ uVar13;
      uVar39 = ~uVar36 & uVar2 ^ uVar4;
      uVar33 = ~uVar4 & uVar36 ^ uVar33;
      uVar4 = uVar38 >> 2 | uVar38 << 0x3e;
      uVar14 = uVar24 >> 0x19 | uVar24 << 0x27;
      uVar20 = ~uVar37 & uVar14 ^ uVar4;
      uVar18 = uVar40 >> 0x3e | uVar40 << 2;
      uVar23 = ~uVar1 & uVar26 ^ uVar23 ^ 0x800a;
      uVar2 = ~uVar4 & uVar37 ^ uVar18;
      uVar6 = ~uVar18 & uVar4 ^ uVar25;
      uVar36 = uVar19 ^ uVar33 ^ uVar11 ^ uVar21 ^ uVar2;
      uVar1 = uVar39 ^ uVar20 ^ uVar8 ^ uVar27 ^ uVar23;
      uVar4 = uVar31 ^ uVar13 ^ uVar9 ^ uVar34 ^ uVar6;
      uVar7 = ~uVar25 & uVar18 ^ uVar14;
      uVar37 = ~uVar14 & uVar25 ^ uVar37;
      uVar26 = uVar22 ^ uVar12 ^ uVar5 ^ uVar10 ^ uVar7;
      uVar14 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar4;
      uVar18 = uVar28 ^ uVar30 ^ uVar16 ^ uVar3 ^ uVar37;
      uVar1 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar1;
      uVar25 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar18;
      uVar26 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar26;
      uVar2 = uVar2 ^ uVar14;
      uVar36 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar36;
      uVar13 = uVar13 ^ uVar26;
      uVar2 = uVar2 >> 0x32 | uVar2 << 0xe;
      uVar7 = uVar7 ^ uVar25;
      uVar23 = uVar23 ^ uVar36;
      uVar18 = uVar7 >> 3 | uVar7 << 0x3d;
      uVar22 = uVar22 ^ uVar25;
      uVar3 = uVar3 ^ uVar1;
      uVar22 = uVar22 >> 0x15 | uVar22 << 0x2b;
      uVar4 = uVar3 >> 0x14 | uVar3 << 0x2c;
      uVar24 = uVar23 ^ 0x800000008000000a ^ ~uVar4 & uVar22;
      uVar3 = uVar13 >> 0x2b | uVar13 << 0x15;
      uVar29 = ~uVar3 & uVar2 ^ uVar22;
      uVar13 = ~uVar2 & uVar23 ^ uVar3;
      uVar3 = ~uVar22 & uVar3 ^ uVar4;
      uVar2 = ~uVar23 & uVar4 ^ uVar2;
      uVar9 = uVar9 ^ uVar26;
      uVar4 = uVar9 >> 0x24 | uVar9 << 0x1c;
      uVar30 = uVar30 ^ uVar1;
      uVar22 = uVar30 >> 0x13 | uVar30 << 0x2d;
      uVar21 = uVar21 ^ uVar14;
      uVar30 = uVar21 >> 0x2c | uVar21 << 0x14;
      uVar32 = ~uVar18 & uVar4 ^ uVar22;
      uVar27 = uVar27 ^ uVar36;
      uVar21 = uVar27 >> 0x3d | uVar27 << 3;
      uVar23 = ~uVar22 & uVar18 ^ uVar21;
      uVar7 = ~uVar30 & uVar21 ^ uVar4;
      uVar9 = ~uVar21 & uVar22 ^ uVar30;
      uVar18 = ~uVar4 & uVar30 ^ uVar18;
      uVar33 = uVar33 ^ uVar14;
      uVar16 = uVar16 ^ uVar1;
      uVar22 = uVar33 >> 0x38 | uVar33 << 8;
      uVar30 = uVar16 >> 0x3f | uVar16 << 1;
      uVar31 = uVar31 ^ uVar26;
      uVar21 = uVar31 >> 0x27 | uVar31 << 0x19;
      uVar20 = uVar20 ^ uVar36;
      uVar10 = uVar10 ^ uVar25;
      uVar16 = uVar20 >> 0x2e | uVar20 << 0x12;
      uVar4 = uVar10 >> 0x3a | uVar10 << 6;
      uVar31 = ~uVar21 & uVar22 ^ uVar4;
      uVar27 = ~uVar16 & uVar30 ^ uVar22;
      uVar10 = ~uVar22 & uVar16 ^ uVar21;
      uVar16 = ~uVar30 & uVar4 ^ uVar16;
      uVar30 = ~uVar4 & uVar21 ^ uVar30;
      uVar11 = uVar11 ^ uVar14;
      uVar14 = uVar14 ^ uVar19;
      uVar33 = uVar11 >> 0x25 | uVar11 << 0x1b;
      uVar8 = uVar8 ^ uVar36;
      uVar21 = uVar8 >> 0x1c | uVar8 << 0x24;
      uVar28 = uVar28 ^ uVar1;
      uVar1 = uVar1 ^ uVar37;
      uVar19 = uVar28 >> 0x36 | uVar28 << 10;
      uVar4 = ~uVar21 & uVar19 ^ uVar33;
      uVar12 = uVar12 ^ uVar25;
      uVar22 = uVar12 >> 0x31 | uVar12 << 0xf;
      uVar11 = ~uVar19 & uVar22 ^ uVar21;
      uVar6 = uVar6 ^ uVar26;
      uVar26 = uVar26 ^ uVar34;
      uVar12 = uVar6 >> 8 | uVar6 << 0x38;
      uVar20 = ~uVar33 & uVar21 ^ uVar12;
      uVar19 = ~uVar22 & uVar12 ^ uVar19;
      uVar25 = uVar25 ^ uVar5;
      uVar36 = uVar36 ^ uVar39;
      uVar22 = ~uVar12 & uVar33 ^ uVar22;
      uVar5 = uVar36 >> 0x17 | uVar36 << 0x29;
      uVar12 = uVar25 >> 2 | uVar25 << 0x3e;
      uVar21 = uVar14 >> 0x19 | uVar14 << 0x27;
      uVar1 = uVar1 >> 0x3e | uVar1 << 2;
      uVar8 = uVar26 >> 9 | uVar26 << 0x37;
      uVar40 = ~uVar1 & uVar12 ^ uVar5;
      uVar38 = ~uVar21 & uVar5 ^ uVar8;
      uVar37 = ~uVar5 & uVar1 ^ uVar21;
      uVar39 = uVar27 ^ uVar22 ^ uVar13 ^ uVar32 ^ uVar40;
      uVar6 = uVar31 ^ uVar11 ^ uVar3 ^ uVar9 ^ uVar38;
      uVar36 = ~uVar8 & uVar21 ^ uVar12;
      uVar5 = uVar10 ^ uVar19 ^ uVar29 ^ uVar23 ^ uVar37;
      uVar1 = ~uVar12 & uVar8 ^ uVar1;
      uVar14 = uVar30 ^ uVar4 ^ uVar24 ^ uVar7 ^ uVar36;
      uVar35 = (uVar39 >> 0x3f | uVar39 << 1) ^ uVar6;
      uVar12 = uVar16 ^ uVar20 ^ uVar2 ^ uVar18 ^ uVar1;
      uVar37 = uVar37 ^ uVar35;
      uVar33 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar12;
      uVar39 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar39;
      uVar21 = uVar37 >> 3 | uVar37 << 0x3d;
      uVar37 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar5;
      uVar1 = uVar1 ^ uVar39;
      uVar36 = uVar36 ^ uVar33;
      uVar14 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar14;
      uVar22 = uVar22 ^ uVar37;
      uVar1 = uVar1 >> 0x32 | uVar1 << 0xe;
      uVar25 = uVar36 >> 0x2e | uVar36 << 0x12;
      uVar40 = uVar40 ^ uVar37;
      uVar12 = uVar22 >> 0x2b | uVar22 << 0x15;
      uVar9 = uVar9 ^ uVar14;
      uVar22 = uVar9 >> 0x14 | uVar9 << 0x2c;
      uVar24 = uVar24 ^ uVar33;
      uVar10 = uVar10 ^ uVar35;
      uVar5 = uVar10 >> 0x15 | uVar10 << 0x2b;
      uVar34 = uVar24 ^ 0x8000000080008081 ^ ~uVar22 & uVar5;
      uVar36 = ~uVar1 & uVar24 ^ uVar12;
      uVar26 = ~uVar12 & uVar1 ^ uVar5;
      uVar5 = ~uVar5 & uVar12 ^ uVar22;
      uVar1 = ~uVar24 & uVar22 ^ uVar1;
      uVar13 = uVar13 ^ uVar37;
      uVar12 = uVar13 >> 0x24 | uVar13 << 0x1c;
      uVar30 = uVar30 ^ uVar33;
      uVar6 = uVar30 >> 0x3d | uVar30 << 3;
      uVar11 = uVar11 ^ uVar14;
      uVar11 = uVar11 >> 0x13 | uVar11 << 0x2d;
      uVar18 = uVar18 ^ uVar39;
      uVar28 = ~uVar21 & uVar12 ^ uVar11;
      uVar30 = uVar18 >> 0x2c | uVar18 << 0x14;
      uVar22 = ~uVar11 & uVar21 ^ uVar6;
      uVar8 = ~uVar6 & uVar11 ^ uVar30;
      uVar10 = ~uVar30 & uVar6 ^ uVar12;
      uVar21 = ~uVar12 & uVar30 ^ uVar21;
      uVar20 = uVar20 ^ uVar39;
      uVar23 = uVar23 ^ uVar35;
      uVar27 = uVar27 ^ uVar37;
      uVar18 = uVar20 >> 0x38 | uVar20 << 8;
      uVar11 = uVar23 >> 0x3a | uVar23 << 6;
      uVar37 = uVar37 ^ uVar32;
      uVar3 = uVar3 ^ uVar14;
      uVar12 = uVar27 >> 0x27 | uVar27 << 0x19;
      uVar30 = uVar3 >> 0x3f | uVar3 << 1;
      uVar23 = ~uVar11 & uVar12 ^ uVar30;
      uVar20 = ~uVar12 & uVar18 ^ uVar11;
      uVar9 = ~uVar25 & uVar30 ^ uVar18;
      uVar30 = ~uVar30 & uVar11 ^ uVar25;
      uVar12 = ~uVar18 & uVar25 ^ uVar12;
      uVar7 = uVar7 ^ uVar33;
      uVar2 = uVar2 ^ uVar39;
      uVar6 = uVar7 >> 0x1c | uVar7 << 0x24;
      uVar39 = uVar39 ^ uVar16;
      uVar16 = uVar2 >> 0x25 | uVar2 << 0x1b;
      uVar19 = uVar19 ^ uVar35;
      uVar35 = uVar35 ^ uVar29;
      uVar31 = uVar31 ^ uVar14;
      uVar14 = uVar14 ^ uVar38;
      uVar29 = uVar31 >> 0x36 | uVar31 << 10;
      uVar3 = ~uVar6 & uVar29 ^ uVar16;
      uVar18 = uVar19 >> 0x31 | uVar19 << 0xf;
      uVar24 = uVar35 >> 2 | uVar35 << 0x3e;
      uVar13 = ~uVar29 & uVar18 ^ uVar6;
      uVar2 = uVar39 >> 0x19 | uVar39 << 0x27;
      uVar32 = uVar14 >> 0x3e | uVar14 << 2;
      uVar11 = uVar40 >> 8 | uVar40 << 0x38;
      uVar7 = ~uVar16 & uVar6 ^ uVar11;
      uVar29 = ~uVar18 & uVar11 ^ uVar29;
      uVar18 = ~uVar11 & uVar16 ^ uVar18;
      uVar33 = uVar33 ^ uVar4;
      uVar4 = uVar33 >> 0x17 | uVar33 << 0x29;
      uVar14 = ~uVar4 & uVar32 ^ uVar2;
      uVar31 = uVar12 ^ uVar29 ^ uVar26 ^ uVar22 ^ uVar14;
      uVar11 = uVar37 >> 9 | uVar37 << 0x37;
      uVar27 = ~uVar2 & uVar4 ^ uVar11;
      uVar4 = ~uVar32 & uVar24 ^ uVar4;
      uVar37 = uVar20 ^ uVar13 ^ uVar5 ^ uVar8 ^ uVar27;
      uVar19 = ~uVar11 & uVar2 ^ uVar24;
      uVar16 = uVar9 ^ uVar18 ^ uVar36 ^ uVar28 ^ uVar4;
      uVar32 = ~uVar24 & uVar11 ^ uVar32;
      uVar6 = uVar23 ^ uVar3 ^ uVar34 ^ uVar10 ^ uVar19;
      uVar2 = uVar30 ^ uVar7 ^ uVar1 ^ uVar21 ^ uVar32;
      uVar11 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar37;
      uVar40 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar6;
      uVar39 = (uVar37 >> 0x3f | uVar37 << 1) ^ uVar2;
      uVar12 = uVar12 ^ uVar11;
      uVar14 = uVar14 ^ uVar11;
      uVar31 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar31;
      uVar34 = uVar34 ^ uVar39;
      uVar12 = uVar12 >> 0x15 | uVar12 << 0x2b;
      uVar19 = uVar19 ^ uVar39;
      uVar16 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar16;
      uVar18 = uVar18 ^ uVar31;
      uVar19 = uVar19 >> 0x2e | uVar19 << 0x12;
      uVar32 = uVar32 ^ uVar16;
      uVar8 = uVar8 ^ uVar40;
      uVar2 = uVar8 >> 0x14 | uVar8 << 0x2c;
      uVar24 = uVar34 ^ 0x8000000000008080 ^ ~uVar2 & uVar12;
      uVar8 = uVar18 >> 0x2b | uVar18 << 0x15;
      uVar18 = uVar32 >> 0x32 | uVar32 << 0xe;
      uVar35 = ~uVar8 & uVar18 ^ uVar12;
      uVar6 = ~uVar12 & uVar8 ^ uVar2;
      uVar12 = uVar14 >> 3 | uVar14 << 0x3d;
      uVar8 = ~uVar18 & uVar34 ^ uVar8;
      uVar18 = ~uVar34 & uVar2 ^ uVar18;
      uVar13 = uVar13 ^ uVar40;
      uVar37 = uVar13 >> 0x13 | uVar13 << 0x2d;
      uVar36 = uVar36 ^ uVar31;
      uVar23 = uVar23 ^ uVar39;
      uVar2 = uVar36 >> 0x24 | uVar36 << 0x1c;
      uVar13 = uVar23 >> 0x3d | uVar23 << 3;
      uVar34 = ~uVar12 & uVar2 ^ uVar37;
      uVar36 = ~uVar37 & uVar12 ^ uVar13;
      uVar21 = uVar21 ^ uVar16;
      uVar21 = uVar21 >> 0x2c | uVar21 << 0x14;
      uVar25 = ~uVar13 & uVar37 ^ uVar21;
      uVar13 = ~uVar21 & uVar13 ^ uVar2;
      uVar12 = ~uVar2 & uVar21 ^ uVar12;
      uVar22 = uVar22 ^ uVar11;
      uVar9 = uVar9 ^ uVar31;
      uVar21 = uVar22 >> 0x3a | uVar22 << 6;
      uVar22 = uVar9 >> 0x27 | uVar9 << 0x19;
      uVar5 = uVar5 ^ uVar40;
      uVar2 = uVar5 >> 0x3f | uVar5 << 1;
      uVar7 = uVar7 ^ uVar16;
      uVar5 = uVar7 >> 0x38 | uVar7 << 8;
      uVar7 = ~uVar19 & uVar2 ^ uVar5;
      uVar37 = ~uVar5 & uVar19 ^ uVar22;
      uVar23 = ~uVar21 & uVar22 ^ uVar2;
      uVar33 = ~uVar22 & uVar5 ^ uVar21;
      uVar19 = ~uVar2 & uVar21 ^ uVar19;
      uVar20 = uVar20 ^ uVar40;
      uVar40 = uVar40 ^ uVar27;
      uVar21 = uVar20 >> 0x36 | uVar20 << 10;
      uVar10 = uVar10 ^ uVar39;
      uVar1 = uVar1 ^ uVar16;
      uVar16 = uVar16 ^ uVar30;
      uVar22 = uVar10 >> 0x1c | uVar10 << 0x24;
      uVar5 = uVar1 >> 0x25 | uVar1 << 0x1b;
      uVar30 = ~uVar22 & uVar21 ^ uVar5;
      uVar29 = uVar29 ^ uVar11;
      uVar2 = uVar29 >> 0x31 | uVar29 << 0xf;
      uVar1 = ~uVar21 & uVar2 ^ uVar22;
      uVar4 = uVar4 ^ uVar31;
      uVar31 = uVar31 ^ uVar28;
      uVar4 = uVar4 >> 8 | uVar4 << 0x38;
      uVar21 = ~uVar2 & uVar4 ^ uVar21;
      uVar20 = ~uVar5 & uVar22 ^ uVar4;
      uVar2 = ~uVar4 & uVar5 ^ uVar2;
      uVar32 = uVar16 >> 0x19 | uVar16 << 0x27;
      uVar11 = uVar11 ^ uVar26;
      uVar39 = uVar39 ^ uVar3;
      uVar11 = uVar11 >> 2 | uVar11 << 0x3e;
      uVar4 = uVar31 >> 9 | uVar31 << 0x37;
      uVar3 = uVar39 >> 0x17 | uVar39 << 0x29;
      uVar10 = uVar40 >> 0x3e | uVar40 << 2;
      uVar31 = ~uVar4 & uVar32 ^ uVar11;
      uVar26 = uVar23 ^ uVar30 ^ uVar24 ^ uVar13 ^ uVar31;
      uVar9 = ~uVar10 & uVar11 ^ uVar3;
      uVar39 = ~uVar32 & uVar3 ^ uVar4;
      uVar32 = ~uVar3 & uVar10 ^ uVar32;
      uVar14 = uVar7 ^ uVar2 ^ uVar8 ^ uVar34 ^ uVar9;
      uVar3 = uVar33 ^ uVar1 ^ uVar6 ^ uVar25 ^ uVar39;
      uVar10 = ~uVar11 & uVar4 ^ uVar10;
      uVar11 = uVar37 ^ uVar21 ^ uVar35 ^ uVar36 ^ uVar32;
      uVar22 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar3;
      uVar14 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar14;
      uVar4 = uVar19 ^ uVar20 ^ uVar18 ^ uVar12 ^ uVar10;
      uVar37 = uVar37 ^ uVar22;
      uVar10 = uVar10 ^ uVar14;
      uVar16 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar4;
      uVar4 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar11;
      uVar31 = uVar31 ^ uVar16;
      uVar26 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar26;
      uVar2 = uVar2 ^ uVar4;
      uVar32 = uVar32 ^ uVar22;
      uVar24 = uVar24 ^ uVar16;
      uVar25 = uVar25 ^ uVar26;
      uVar5 = uVar37 >> 0x15 | uVar37 << 0x2b;
      uVar3 = uVar2 >> 0x2b | uVar2 << 0x15;
      uVar11 = uVar25 >> 0x14 | uVar25 << 0x2c;
      uVar37 = uVar24 ^ 0x80000001 ^ ~uVar11 & uVar5;
      uVar10 = uVar10 >> 0x32 | uVar10 << 0xe;
      uVar25 = ~uVar3 & uVar10 ^ uVar5;
      uVar27 = ~uVar5 & uVar3 ^ uVar11;
      uVar2 = uVar32 >> 3 | uVar32 << 0x3d;
      uVar11 = ~uVar24 & uVar11 ^ uVar10;
      uVar3 = ~uVar10 & uVar24 ^ uVar3;
      uVar1 = uVar1 ^ uVar26;
      uVar12 = uVar12 ^ uVar14;
      uVar10 = uVar1 >> 0x13 | uVar1 << 0x2d;
      uVar8 = uVar8 ^ uVar4;
      uVar12 = uVar12 >> 0x2c | uVar12 << 0x14;
      uVar1 = uVar8 >> 0x24 | uVar8 << 0x1c;
      uVar24 = ~uVar2 & uVar1 ^ uVar10;
      uVar23 = uVar23 ^ uVar16;
      uVar5 = uVar23 >> 0x3d | uVar23 << 3;
      uVar8 = ~uVar10 & uVar2 ^ uVar5;
      uVar23 = ~uVar5 & uVar10 ^ uVar12;
      uVar10 = ~uVar12 & uVar5 ^ uVar1;
      uVar2 = ~uVar1 & uVar12 ^ uVar2;
      uVar12 = uVar31 >> 0x2e | uVar31 << 0x12;
      uVar6 = uVar6 ^ uVar26;
      uVar20 = uVar20 ^ uVar14;
      uVar1 = uVar6 >> 0x3f | uVar6 << 1;
      uVar7 = uVar7 ^ uVar4;
      uVar31 = uVar20 >> 0x38 | uVar20 << 8;
      uVar6 = uVar7 >> 0x27 | uVar7 << 0x19;
      uVar36 = uVar36 ^ uVar22;
      uVar5 = uVar36 >> 0x3a | uVar36 << 6;
      uVar20 = ~uVar12 & uVar1 ^ uVar31;
      uVar7 = ~uVar5 & uVar6 ^ uVar1;
      uVar32 = ~uVar6 & uVar31 ^ uVar5;
      uVar6 = ~uVar31 & uVar12 ^ uVar6;
      uVar12 = ~uVar1 & uVar5 ^ uVar12;
      uVar13 = uVar13 ^ uVar16;
      uVar18 = uVar18 ^ uVar14;
      uVar5 = uVar13 >> 0x1c | uVar13 << 0x24;
      uVar14 = uVar14 ^ uVar19;
      uVar31 = uVar18 >> 0x25 | uVar18 << 0x1b;
      uVar28 = uVar14 >> 0x19 | uVar14 << 0x27;
      uVar33 = uVar33 ^ uVar26;
      uVar26 = uVar26 ^ uVar39;
      uVar36 = uVar33 >> 0x36 | uVar33 << 10;
      uVar1 = ~uVar5 & uVar36 ^ uVar31;
      uVar21 = uVar21 ^ uVar22;
      uVar22 = uVar22 ^ uVar35;
      uVar13 = uVar21 >> 0x31 | uVar21 << 0xf;
      uVar18 = ~uVar36 & uVar13 ^ uVar5;
      uVar9 = uVar9 ^ uVar4;
      uVar4 = uVar4 ^ uVar34;
      uVar19 = uVar9 >> 8 | uVar9 << 0x38;
      uVar36 = ~uVar13 & uVar19 ^ uVar36;
      uVar13 = ~uVar19 & uVar31 ^ uVar13;
      uVar19 = ~uVar31 & uVar5 ^ uVar19;
      uVar21 = uVar4 >> 9 | uVar4 << 0x37;
      uVar16 = uVar16 ^ uVar30;
      uVar4 = uVar22 >> 2 | uVar22 << 0x3e;
      uVar16 = uVar16 >> 0x17 | uVar16 << 0x29;
      uVar5 = uVar26 >> 0x3e | uVar26 << 2;
      uVar33 = ~uVar21 & uVar28 ^ uVar4;
      uVar30 = ~uVar5 & uVar4 ^ uVar16;
      uVar14 = ~uVar28 & uVar16 ^ uVar21;
      uVar21 = ~uVar4 & uVar21 ^ uVar5;
      uVar22 = uVar7 ^ uVar1 ^ uVar37 ^ uVar10 ^ uVar33;
      uVar28 = ~uVar16 & uVar5 ^ uVar28;
      uVar9 = uVar20 ^ uVar13 ^ uVar3 ^ uVar24 ^ uVar30;
      uVar16 = uVar32 ^ uVar18 ^ uVar27 ^ uVar23 ^ uVar14;
      uVar4 = uVar12 ^ uVar19 ^ uVar11 ^ uVar2 ^ uVar21;
      uVar31 = uVar6 ^ uVar36 ^ uVar25 ^ uVar8 ^ uVar28;
      uVar5 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar16;
      uVar16 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar4;
      uVar4 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar31;
      uVar31 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar22;
      uVar9 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar9;
      uVar13 = uVar13 ^ uVar4;
      uVar28 = uVar28 ^ uVar5;
      uVar33 = uVar33 ^ uVar16;
      uVar21 = uVar21 ^ uVar9;
      local_128 = uVar28 >> 3 | uVar28 << 0x3d;
      uVar21 = uVar21 >> 0x32 | uVar21 << 0xe;
      uVar23 = uVar23 ^ uVar31;
      uVar37 = uVar37 ^ uVar16;
      uVar6 = uVar6 ^ uVar5;
      uVar22 = uVar23 >> 0x14 | uVar23 << 0x2c;
      uVar2 = uVar2 ^ uVar9;
      local_d8 = uVar6 >> 0x15 | uVar6 << 0x2b;
      local_118 = uVar37 ^ 0x8000000080008008 ^ ~uVar22 & local_d8;
      local_d0 = uVar13 >> 0x2b | uVar13 << 0x15;
      local_f8 = ~local_d8 & local_d0 ^ uVar22;
      local_d8 = ~local_d0 & uVar21 ^ local_d8;
      local_e0 = ~uVar37 & uVar22 ^ uVar21;
      local_d0 = ~uVar21 & uVar37 ^ local_d0;
      uVar21 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar7 = uVar7 ^ uVar16;
      uVar22 = uVar7 >> 0x3d | uVar7 << 3;
      uVar19 = uVar19 ^ uVar9;
      uVar3 = uVar3 ^ uVar4;
      uVar18 = uVar18 ^ uVar31;
      uVar2 = uVar3 >> 0x24 | uVar3 << 0x1c;
      uVar18 = uVar18 >> 0x13 | uVar18 << 0x2d;
      local_108 = ~local_128 & uVar2 ^ uVar18;
      local_c8 = ~uVar18 & local_128 ^ uVar22;
      uVar19 = uVar19 >> 0x38 | uVar19 << 8;
      local_100 = ~uVar21 & uVar22 ^ uVar2;
      local_120 = ~uVar22 & uVar18 ^ uVar21;
      local_128 = ~uVar2 & uVar21 ^ local_128;
      local_110 = uVar33 >> 0x2e | uVar33 << 0x12;
      uVar8 = uVar8 ^ uVar5;
      uVar20 = uVar20 ^ uVar4;
      uVar18 = uVar8 >> 0x3a | uVar8 << 6;
      uVar27 = uVar27 ^ uVar31;
      uVar21 = uVar20 >> 0x27 | uVar20 << 0x19;
      uVar2 = uVar27 >> 0x3f | uVar27 << 1;
      local_e8 = ~uVar21 & uVar19 ^ uVar18;
      local_158 = ~local_110 & uVar2 ^ uVar19;
      local_130 = ~uVar19 & local_110 ^ uVar21;
      local_148 = ~uVar18 & uVar21 ^ uVar2;
      local_110 = ~uVar2 & uVar18 ^ local_110;
      uVar30 = uVar30 ^ uVar4;
      uVar4 = uVar4 ^ uVar24;
      uVar36 = uVar36 ^ uVar5;
      uVar10 = uVar10 ^ uVar16;
      local_150 = uVar30 >> 8 | uVar30 << 0x38;
      uVar16 = uVar16 ^ uVar1;
      uVar5 = uVar5 ^ uVar25;
      uVar32 = uVar32 ^ uVar31;
      local_138 = uVar36 >> 0x31 | uVar36 << 0xf;
      uVar31 = uVar31 ^ uVar14;
      uVar2 = uVar10 >> 0x1c | uVar10 << 0x24;
      uVar11 = uVar11 ^ uVar9;
      uVar18 = uVar32 >> 0x36 | uVar32 << 10;
      uVar9 = uVar9 ^ uVar12;
      local_140 = ~local_138 & local_150 ^ uVar18;
      uVar1 = uVar11 >> 0x25 | uVar11 << 0x1b;
      uVar30 = ~uVar18 & local_138 ^ uVar2;
      local_f0 = ~uVar2 & uVar18 ^ uVar1;
      local_a8 = uVar16 >> 0x17 | uVar16 << 0x29;
      uVar11 = uVar4 >> 9 | uVar4 << 0x37;
      local_138 = ~local_150 & uVar1 ^ local_138;
      local_150 = ~uVar1 & uVar2 ^ local_150;
      local_b0 = uVar31 >> 0x3e | uVar31 << 2;
      uVar4 = uVar5 >> 2 | uVar5 << 0x3e;
      uVar1 = uVar9 >> 0x19 | uVar9 << 0x27;
      local_c0 = ~local_a8 & local_b0 ^ uVar1;
      local_160 = ~uVar11 & uVar1 ^ uVar4;
      local_b8 = ~uVar1 & local_a8 ^ uVar11;
      local_a8 = ~local_b0 & uVar4 ^ local_a8;
      local_b0 = ~uVar4 & uVar11 ^ local_b0;
      data = (uchar *)((long)data + (ulong)laneCount * 8);
      uVar17 = uVar17 - uVar15;
    } while (uVar15 <= uVar17);
  }
  *(ulong *)state = local_118;
  *(ulong *)((long)state + 8) = local_f8;
  *(ulong *)((long)state + 0x10) = local_d8;
  *(ulong *)((long)state + 0x18) = local_d0;
  *(ulong *)((long)state + 0x20) = local_e0;
  *(ulong *)((long)state + 0x28) = local_100;
  *(ulong *)((long)state + 0x30) = local_120;
  *(ulong *)((long)state + 0x38) = local_c8;
  *(ulong *)((long)state + 0x40) = local_108;
  *(ulong *)((long)state + 0x48) = local_128;
  *(ulong *)((long)state + 0x50) = local_148;
  *(ulong *)((long)state + 0x58) = local_e8;
  *(ulong *)((long)state + 0x60) = local_130;
  *(ulong *)((long)state + 0x68) = local_158;
  *(ulong *)((long)state + 0x70) = local_110;
  *(ulong *)((long)state + 0x78) = local_f0;
  *(ulong *)((long)state + 0x80) = uVar30;
  *(ulong *)((long)state + 0x88) = local_140;
  *(ulong *)((long)state + 0x90) = local_138;
  *(ulong *)((long)state + 0x98) = local_150;
  *(ulong *)((long)state + 0xa0) = local_160;
  *(ulong *)((long)state + 0xa8) = local_b8;
  *(ulong *)((long)state + 0xb0) = local_c0;
  *(ulong *)((long)state + 0xb8) = local_a8;
  *(ulong *)((long)state + 0xc0) = local_b0;
  return dataByteLen - uVar17;
}

Assistant:

size_t KeccakP1600_12rounds_FastLoop_Absorb(void *state, unsigned int laneCount, const unsigned char *data, size_t dataByteLen)
{
    size_t originalDataByteLen = dataByteLen;
    declareABCDE
    #ifndef KeccakP1600_fullUnrolling
    unsigned int i;
    #endif
    uint64_t *stateAsLanes = (uint64_t*)state;
    uint64_t *inDataAsLanes = (uint64_t*)data;

    copyFromState(A, stateAsLanes)
    while(dataByteLen >= laneCount*8) {
        addInput(A, inDataAsLanes, laneCount)
        rounds12
        inDataAsLanes += laneCount;
        dataByteLen -= laneCount*8;
    }
    copyToState(stateAsLanes, A)
    return originalDataByteLen - dataByteLen;
}